

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O2

void xml_reporter_start_test(TestReporter *reporter,char *testname)

{
  void *memo;
  CgreenBreadcrumb *breadcrumb;
  undefined8 uVar1;
  xmlChar *pxVar2;
  FILE *pFVar3;
  long lVar4;
  
  memo = reporter->memo;
  lVar4 = (long)context_stack_p * 0x28;
  uVar1 = xmlNewChild((&child_output_tmpfile)[(long)context_stack_p * 5],0,"testcase",0);
  *(undefined8 *)(&DAT_00117f98 + lVar4) = uVar1;
  pxVar2 = xmlEscapePropValue(testname);
  xmlNewProp(*(undefined8 *)(&DAT_00117f98 + lVar4),"name",pxVar2);
  (*_xmlFree)(pxVar2);
  breadcrumb = reporter->breadcrumb;
  *(int *)((long)memo + 8) = breadcrumb->depth + -1;
  suite_path[0] = '\0';
  walk_breadcrumb(breadcrumb,print_path_segment_walker,memo);
  pxVar2 = xmlEscapePropValue(suite_path);
  xmlNewProp(*(undefined8 *)(&DAT_00117f98 + lVar4),"classname",pxVar2);
  (*_xmlFree)(pxVar2);
  reporter_start_test(reporter,testname);
  pFVar3 = tmpfile();
  child_output_tmpfile = (FILE *)pFVar3;
  uVar1 = xmlGetCharEncodingHandler(1);
  uVar1 = xmlOutputBufferCreateFile(pFVar3,uVar1);
  child_output_writer = (xmlTextWriterPtr)xmlNewTextWriter(uVar1);
  return;
}

Assistant:

static void xml_reporter_start_test(TestReporter *reporter, const char *testname) {
    XmlMemo *memo = (XmlMemo *)reporter->memo;
    struct xml_suite_context *ctx = &context_stack[context_stack_p-1];

    ctx->curTest = xmlNewChild(ctx->suite, NULL, XMLSTRING("testcase"), NULL);
    xmlChar *xml_testname = xmlEscapePropValue(testname);
    xmlNewProp(ctx->curTest, XMLSTRING("name"), xml_testname);
    xmlFree(xml_testname);

    memo->segment_count = reporter->breadcrumb->depth - 1;
    suite_path[0] = '\0';
    walk_breadcrumb(reporter->breadcrumb, print_path_segment_walker, memo);
    xmlChar* xml_suite_path = xmlEscapePropValue(suite_path);
    xmlNewProp(ctx->curTest, XMLSTRING("classname"), xml_suite_path);
    xmlFree(xml_suite_path);

    reporter_start_test(reporter, testname);

    child_output_tmpfile = tmpfile();
    xmlOutputBufferPtr tmpfileBuf
        = xmlOutputBufferCreateFile(child_output_tmpfile,
                                    xmlGetCharEncodingHandler(XML_CHAR_ENCODING_UTF8));
    child_output_writer = xmlNewTextWriter(tmpfileBuf);
}